

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O3

GLFWbool waitForAnyEvent(double *timeout)

{
  uint uVar1;
  ulong uVar2;
  nfds_t count;
  pollfd fds [3];
  pollfd local_48;
  int local_40;
  undefined4 local_3c;
  undefined8 local_38;
  
  local_48.fd = *(int *)(_glfw.x11.display + 0x10);
  local_48.events = 1;
  local_48.revents = 0;
  local_40 = _glfw.x11.emptyEventPipe[0];
  local_3c = 1;
  local_38 = 0;
  if (_glfw.linjs.inotify < 1) {
    count = 2;
  }
  else {
    local_38 = CONCAT44(1,_glfw.linjs.inotify);
    count = 3;
  }
  uVar2 = XPending();
  if ((int)uVar2 == 0) {
    while( true ) {
      uVar1 = waitForData(&local_48,count,timeout);
      uVar2 = (ulong)uVar1;
      if (uVar1 == 0) break;
      uVar2 = 0;
      do {
        if ((*(byte *)((long)&local_3c + uVar2 * 8 + 2) & 1) != 0) goto LAB_0011a370;
        uVar2 = uVar2 + 1;
      } while (count - 1 != uVar2);
      uVar2 = XPending(_glfw.x11.display);
      if ((int)uVar2 != 0) break;
    }
  }
LAB_0011a370:
  return (GLFWbool)uVar2;
}

Assistant:

static GLFWbool waitForAnyEvent(double* timeout)
{
    nfds_t count = 2;
    struct pollfd fds[3] =
    {
        { ConnectionNumber(_glfw.x11.display), POLLIN },
        { _glfw.x11.emptyEventPipe[0], POLLIN }
    };

#if defined(__linux__)
    if (_glfw.linjs.inotify > 0)
        fds[count++] = (struct pollfd) { _glfw.linjs.inotify, POLLIN };
#endif

    while (!XPending(_glfw.x11.display))
    {
        if (!waitForData(fds, count, timeout))
            return GLFW_FALSE;

        for (int i = 1; i < count; i++)
        {
            if (fds[i].revents & POLLIN)
                return GLFW_TRUE;
        }
    }

    return GLFW_TRUE;
}